

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

LY_ERR xpath_string_length(lyxp_set **args,uint32_t arg_count,lyxp_set *set,uint32_t options)

{
  ly_bool lVar1;
  LY_ERR ret__;
  LY_ERR LVar2;
  lysc_node *plVar3;
  size_t sVar4;
  char *pcVar5;
  char *format;
  ly_ctx *ctx;
  
  if ((options & 0x1c) == 0) {
    if (arg_count == 0) {
      LVar2 = lyxp_set_cast(set,LYXP_SET_STRING);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      sVar4 = strlen((set->val).str);
    }
    else {
      LVar2 = lyxp_set_cast(*args,LYXP_SET_STRING);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      sVar4 = strlen(((*args)->val).str);
    }
    set_fill_number(set,(longdouble)(long)sVar4 +
                        (longdouble)*(float *)(&DAT_001cea08 + (ulong)((long)sVar4 < 0) * 4));
    return LY_SUCCESS;
  }
  if (arg_count == 0) {
    if ((set->type != LYXP_SET_SCNODE_SET) ||
       (plVar3 = warn_get_scnode_in_ctx(set), plVar3 == (lysc_node *)0x0)) goto LAB_001a7ac9;
    if ((plVar3->nodetype & 0xc) == 0) {
      ctx = set->ctx;
      pcVar5 = lys_nodetype2str(plVar3->nodetype);
      format = "Argument #0 of %s is a %s node \"%s\".";
    }
    else {
      lVar1 = warn_is_string_type((lysc_type *)plVar3[1].parent);
      if (lVar1 != '\0') goto LAB_001a7ac9;
      ctx = set->ctx;
      pcVar5 = plVar3->name;
      format = "Argument #0 of %s is node \"%s\", not of string-type.";
    }
  }
  else {
    if (((*args)->type != LYXP_SET_SCNODE_SET) ||
       (plVar3 = warn_get_scnode_in_ctx(*args), plVar3 == (lysc_node *)0x0)) goto LAB_001a7ac9;
    if ((plVar3->nodetype & 0xc) == 0) {
      ctx = set->ctx;
      pcVar5 = lys_nodetype2str(plVar3->nodetype);
      format = "Argument #1 of %s is a %s node \"%s\".";
    }
    else {
      lVar1 = warn_is_string_type((lysc_type *)plVar3[1].parent);
      if (lVar1 != '\0') goto LAB_001a7ac9;
      ctx = set->ctx;
      pcVar5 = plVar3->name;
      format = "Argument #1 of %s is node \"%s\", not of string-type.";
    }
  }
  ly_log(ctx,LY_LLWRN,LY_SUCCESS,format,"xpath_string_length",pcVar5);
LAB_001a7ac9:
  set_scnode_clear_ctx(set,1);
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
xpath_string_length(struct lyxp_set **args, uint32_t arg_count, struct lyxp_set *set, uint32_t options)
{
    struct lysc_node_leaf *sleaf;
    LY_ERR rc = LY_SUCCESS;

    if (options & LYXP_SCNODE_ALL) {
        if (arg_count && (args[0]->type == LYXP_SET_SCNODE_SET) && (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_string_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #1 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
            }
        }
        if (!arg_count && (set->type == LYXP_SET_SCNODE_SET) && (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(set))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #0 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype), sleaf->name);
            } else if (!warn_is_string_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #0 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
            }
        }
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_VAL);
        return rc;
    }

    if (arg_count) {
        rc = lyxp_set_cast(args[0], LYXP_SET_STRING);
        LY_CHECK_RET(rc);
        set_fill_number(set, strlen(args[0]->val.str));
    } else {
        rc = lyxp_set_cast(set, LYXP_SET_STRING);
        LY_CHECK_RET(rc);
        set_fill_number(set, strlen(set->val.str));
    }

    return LY_SUCCESS;
}